

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall
UI::renderMessages(UI *this,
                  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *messages,
                  int width,bool isThread)

{
  int iVar1;
  __type _Var2;
  bool bVar3;
  size_type sVar4;
  char *pcVar5;
  ImGuiIO *pIVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  byte in_CL;
  int in_EDX;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *in_RSI;
  long in_RDI;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  int offsetX;
  ImVec2 savePos;
  string *username_1;
  int i_2;
  int w_1;
  string *username;
  int i_1;
  int w;
  ImDrawList *drawList;
  bool doReplyInThead;
  bool doUpvote;
  ImVec2 p1;
  ImVec2 p0;
  size_type l;
  string curDate;
  value_type *user;
  int32_t *uid;
  value_type *message;
  int i;
  string lastDate;
  int32_t lastUid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  ImGuiIO *in_stack_fffffffffffffce8;
  ImGuiIO *in_stack_fffffffffffffcf0;
  undefined2 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfa;
  undefined1 in_stack_fffffffffffffcfb;
  float in_stack_fffffffffffffcfc;
  ImGuiIO *in_stack_fffffffffffffd00;
  ImGuiIO *in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  undefined1 in_stack_fffffffffffffd18 [16];
  char *local_2c8;
  char *local_290;
  int32_t t_s;
  undefined1 in_stack_fffffffffffffe28 [16];
  ImVec2 local_1ac;
  ImVec2 local_1a4;
  ImVec2 local_19c;
  ImVec2 local_194;
  ImVec2 local_18c;
  int local_184;
  ImVec2 local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  int local_170;
  int local_16c;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  int local_148;
  int local_144;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130 [5];
  ImVec2 local_108;
  ImVec2 local_100;
  ImDrawList *local_f8;
  byte local_ea;
  byte local_e9;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8 [5];
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  long local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  reference local_70;
  int32_t *local_68;
  const_reference local_60;
  int local_58;
  allocator<char> local_41 [37];
  int local_1c;
  byte local_15;
  int local_14;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *local_10;
  
  local_15 = in_CL & 1;
  local_1c = -1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd18._8_8_,in_stack_fffffffffffffd18._0_8_,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffd17,
                      CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
  std::allocator<char>::~allocator(local_41);
  ImGui::PushTextWrapPos(in_stack_fffffffffffffce4);
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    t_s = in_stack_fffffffffffffe28._4_4_;
    sVar4 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::size(local_10);
    if ((int)sVar4 <= iVar1) break;
    local_60 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::operator[]
                         (local_10,(long)local_58);
    local_68 = &(local_60->msg).uid;
    local_70 = std::vector<User,_std::allocator<User>_>::operator[]
                         ((vector<User,_std::allocator<User>_> *)(in_RDI + 0x58),(long)*local_68);
    ImGui::PushID((int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
    tToDate_abi_cxx11_(t_s);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffcfc,
                                     CONCAT13(in_stack_fffffffffffffcfb,
                                              CONCAT12(in_stack_fffffffffffffcfa,
                                                       in_stack_fffffffffffffcf8))));
    if (((_Var2 ^ 0xffU) & 1) != 0) {
      sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_90);
      local_98 = sVar9 + 6;
      ImGui::Text("%s","");
      renderSeparator((UI *)in_stack_fffffffffffffd00,
                      (char *)CONCAT44(in_stack_fffffffffffffcfc,
                                       CONCAT13(in_stack_fffffffffffffcfb,
                                                CONCAT12(in_stack_fffffffffffffcfa,
                                                         in_stack_fffffffffffffcf8))),
                      (char *)in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                      (int)in_stack_fffffffffffffce4,
                      SUB41((uint)in_stack_fffffffffffffce0 >> 0x18,0));
      ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f216);
      ImGui::Text("%s",pcVar5);
      ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      renderSeparator((UI *)in_stack_fffffffffffffd00,
                      (char *)CONCAT44(in_stack_fffffffffffffcfc,
                                       CONCAT13(in_stack_fffffffffffffcfb,
                                                CONCAT12(in_stack_fffffffffffffcfa,
                                                         in_stack_fffffffffffffcf8))),
                      (char *)in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                      (int)in_stack_fffffffffffffce4,
                      SUB41((uint)in_stack_fffffffffffffce0 >> 0x18,0));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_a8 = ImGui::GetCursorScreenPos();
    in_stack_fffffffffffffe28._8_4_ = extraout_XMM0_Dc;
    in_stack_fffffffffffffe28._0_4_ = local_a8.x;
    in_stack_fffffffffffffe28._4_4_ = local_a8.y;
    in_stack_fffffffffffffe28._12_4_ = extraout_XMM0_Dd;
    fVar12 = local_a8.x;
    local_b0 = ImGui::GetCursorScreenPos();
    ImVec2::ImVec2(&local_a0,fVar12,local_b0.y);
    if (local_1c != *local_68) {
      ImGui::Text("%s","");
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f3d8);
      ImGui::TextColored((ImVec4 *)(in_RDI + 0x19c),"%s",pcVar5);
      ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      tToTime_abi_cxx11_(in_stack_fffffffffffffe28._4_4_);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f441);
      ImGui::TextColored((ImVec4 *)(in_RDI + 0x1ac),"%s",pcVar5);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    }
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x12f4a2);
    ImGui::Text("%s",pcVar5);
    if (0 < (local_60->msg).reactUp) {
      ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[+]");
      ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      ImGui::Text("%d",(ulong)(uint)(local_60->msg).reactUp);
    }
    if (0 < (local_60->msg).reactDown) {
      if (0 < (local_60->msg).reactUp) {
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      }
      ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[-]");
      ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      ImGui::Text("%d",(ulong)(uint)(local_60->msg).reactDown);
    }
    sVar4 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::size
                      (&local_60->replies);
    if (sVar4 != 0) {
      if ((0 < (local_60->msg).reactUp) || (0 < (local_60->msg).reactDown)) {
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        ImGui::Text("|");
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
      }
      sVar4 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::size
                        (&local_60->replies);
      ImGui::TextColored((ImVec4 *)(in_RDI + 0x1dc),"%d replies",sVar4 & 0xffffffff);
    }
    local_e0 = ImGui::GetCursorScreenPos();
    fVar12 = local_e0.x + (float)local_14;
    local_e8 = ImGui::GetCursorScreenPos();
    ImVec2::ImVec2(local_d8,fVar12,local_e8.y);
    local_e9 = 0;
    local_ea = 0;
    bVar3 = ImGui::IsWindowHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
    if ((bVar3) &&
       (bVar3 = ImGui::IsMouseHoveringRect
                          (in_stack_fffffffffffffd18._0_8_,
                           (ImVec2 *)
                           CONCAT17(in_stack_fffffffffffffd17,
                                    CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)),
                           SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0)), bVar3)) {
      local_f8 = ImGui::GetWindowDrawList();
      ImVec2::ImVec2(&local_100,local_a0.x,local_a0.y + 1.0);
      ImVec2::ImVec2(&local_108,local_d8[0].x,local_d8[0].y + -1.0);
      ImGui::ColorConvertFloat4ToU32
                ((ImVec4 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      ImDrawList::AddRectFilled
                ((ImDrawList *)in_stack_fffffffffffffd00,
                 (ImVec2 *)
                 CONCAT44(in_stack_fffffffffffffcfc,
                          CONCAT13(in_stack_fffffffffffffcfb,
                                   CONCAT12(in_stack_fffffffffffffcfa,in_stack_fffffffffffffcf8))),
                 (ImVec2 *)in_stack_fffffffffffffcf0,
                 (ImU32)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                 SUB84(in_stack_fffffffffffffce8,0),(ImDrawCornerFlags)in_stack_fffffffffffffce4);
      ImGui::SetCursorScreenPos
                ((ImVec2 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      if (local_1c != *local_68) {
        ImGui::Text("%s","");
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f869
                      );
        ImGui::TextColored((ImVec4 *)(in_RDI + 0x19c),"%s",pcVar5);
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        tToTime_abi_cxx11_(in_stack_fffffffffffffe28._4_4_);
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f8d2
                      );
        ImGui::TextColored((ImVec4 *)(in_RDI + 0x1ac),"%s",pcVar5);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12f933);
      ImGui::Text("%s");
      if (0 < (local_60->msg).reactUp) {
        ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[+]");
        bVar3 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
        if (bVar3) {
          pIVar6 = ImGui::GetIO();
          ImVec2::ImVec2(local_130,(pIVar6->MousePos).x + -10.0,local_a0.y + -4.0);
          ImVec2::ImVec2(&local_138,0.0,0.0);
          ImGui::SetNextWindowPos(local_130,0,&local_138);
          ImVec2::ImVec2(&local_140,40.0,0.0);
          ImGui::SetNextWindowSize(&local_140,0);
          ImGui::BeginTooltip();
          ImGui::Text("%s","");
          ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[+]");
          ImGui::Text("%s","");
          local_144 = 0;
          for (local_148 = 0; local_148 < (local_60->msg).reactUp; local_148 = local_148 + 1) {
            uVar7 = (ulong)local_148;
            sVar4 = std::vector<User,_std::allocator<User>_>::size
                              ((vector<User,_std::allocator<User>_> *)(in_RDI + 0x58));
            pvVar8 = std::vector<User,_std::allocator<User>_>::operator[]
                               ((vector<User,_std::allocator<User>_> *)(in_RDI + 0x58),uVar7 % sVar4
                               );
            local_150 = &pvVar8->username;
            pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x12fb55);
            if (local_148 == (local_60->msg).reactUp + -1) {
              local_290 = "";
            }
            else {
              local_290 = ",";
              if (local_148 == (local_60->msg).reactUp + -2) {
                local_290 = " and";
              }
            }
            ImGui::TextColored((ImVec4 *)(in_RDI + 0x19c),"%s%s",pcVar5,local_290);
            sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(local_150);
            local_144 = local_144 + (int)sVar9;
            if (local_144 < 0x14) {
              ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
            }
            else {
              local_144 = 0;
            }
          }
          ImGui::Text("reacted with :+1:");
          ImGui::Text("%s","");
          ImGui::EndTooltip();
        }
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        ImGui::Text("%d");
      }
      if (0 < (local_60->msg).reactDown) {
        if (0 < (local_60->msg).reactUp) {
          ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        }
        ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[-]");
        bVar3 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
        if (bVar3) {
          pIVar6 = ImGui::GetIO();
          ImVec2::ImVec2(&local_158,(pIVar6->MousePos).x + -10.0,local_a0.y + -4.0);
          ImVec2::ImVec2(&local_160,0.0,0.0);
          ImGui::SetNextWindowPos(&local_158,0,&local_160);
          ImVec2::ImVec2(&local_168,40.0,0.0);
          ImGui::SetNextWindowSize(&local_168,0);
          ImGui::BeginTooltip();
          ImGui::Text("%s","");
          ImGui::TextColored((ImVec4 *)(in_RDI + 0x1cc),"%s","[-]");
          ImGui::Text("%s","");
          local_16c = 0;
          for (local_170 = 0; local_170 < (local_60->msg).reactDown; local_170 = local_170 + 1) {
            uVar7 = (ulong)local_170;
            sVar4 = std::vector<User,_std::allocator<User>_>::size
                              ((vector<User,_std::allocator<User>_> *)(in_RDI + 0x58));
            pvVar8 = std::vector<User,_std::allocator<User>_>::operator[]
                               ((vector<User,_std::allocator<User>_> *)(in_RDI + 0x58),uVar7 % sVar4
                               );
            local_178 = &pvVar8->username;
            pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x12fec4);
            if (local_170 == (local_60->msg).reactDown + -1) {
              local_2c8 = "";
            }
            else {
              local_2c8 = ",";
              if (local_170 == (local_60->msg).reactDown + -2) {
                local_2c8 = " and";
              }
            }
            ImGui::TextColored((ImVec4 *)(in_RDI + 0x19c),"%s%s",pcVar5,local_2c8);
            sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(local_178);
            local_16c = local_16c + (int)sVar9;
            if (local_16c < 0x14) {
              ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
            }
            else {
              local_16c = 0;
            }
          }
          ImGui::Text("reacted with :-1:");
          ImGui::Text("%s","");
          ImGui::EndTooltip();
        }
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        ImGui::Text("%d");
      }
      sVar4 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::size
                        (&local_60->replies);
      if (sVar4 != 0) {
        if ((0 < (local_60->msg).reactUp) || (0 < (local_60->msg).reactDown)) {
          ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          ImGui::Text("|");
          ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        }
        sVar4 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::size
                          (&local_60->replies);
        ImGui::TextColored((ImVec4 *)(in_RDI + 0x1dc),"%d replies",sVar4 & 0xffffffff);
        bVar3 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
        if (bVar3) {
          ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          ImGui::SmallButton((char *)in_stack_fffffffffffffcf0);
          bVar3 = ImGui::IsMouseDown(0);
          if (bVar3) {
            local_ea = 1;
          }
        }
      }
      local_180 = ImGui::GetCursorScreenPos();
      in_stack_fffffffffffffd18._8_4_ = extraout_XMM0_Dc_00;
      in_stack_fffffffffffffd18._0_4_ = local_180.x;
      in_stack_fffffffffffffd18._4_4_ = local_180.y;
      in_stack_fffffffffffffd18._12_4_ = extraout_XMM0_Dd_00;
      local_184 = ((byte)~local_15 & 1) * 5 + 7;
      ImVec2::ImVec2(&local_18c,local_d8[0].x - (float)local_184,local_a0.y);
      ImGui::SetCursorScreenPos
                ((ImVec2 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      ImGui::SmallButton((char *)in_stack_fffffffffffffcf0);
      in_stack_fffffffffffffd17 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0)
      ;
      if ((bool)in_stack_fffffffffffffd17) {
        in_stack_fffffffffffffd16 = ImGui::IsMouseReleased(0);
        if ((bool)in_stack_fffffffffffffd16) {
          local_e9 = 1;
        }
        in_stack_fffffffffffffd08 = ImGui::GetIO();
        in_stack_fffffffffffffcfc = (in_stack_fffffffffffffd08->MousePos).x + -10.0;
        in_stack_fffffffffffffd00 = ImGui::GetIO();
        ImVec2::ImVec2(&local_194,in_stack_fffffffffffffcfc,
                       (in_stack_fffffffffffffd00->MousePos).y + -2.0);
        ImVec2::ImVec2(&local_19c,0.0,0.0);
        ImGui::SetNextWindowPos(&local_194,0,&local_19c);
        ImGui::SetTooltip("React with +1");
      }
      if ((local_15 & 1) == 0) {
        ImGui::SameLine(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
        ImGui::SmallButton((char *)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffcfb =
             ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
        if ((bool)in_stack_fffffffffffffcfb) {
          in_stack_fffffffffffffcfa = ImGui::IsMouseDown(0);
          if ((bool)in_stack_fffffffffffffcfa) {
            local_ea = 1;
          }
          in_stack_fffffffffffffcf0 = ImGui::GetIO();
          in_stack_fffffffffffffce4 = (in_stack_fffffffffffffcf0->MousePos).x + -16.0;
          in_stack_fffffffffffffce8 = ImGui::GetIO();
          ImVec2::ImVec2(&local_1a4,in_stack_fffffffffffffce4,
                         (in_stack_fffffffffffffce8->MousePos).y + -2.0);
          ImVec2::ImVec2(&local_1ac,0.0,0.0);
          ImGui::SetNextWindowPos(&local_1a4,0,&local_1ac);
          ImGui::SetTooltip("Reply in thread");
        }
      }
      ImGui::SetCursorScreenPos
                ((ImVec2 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    }
    if (((local_e9 & 1) != 0) && ((local_15 & 1) == 0)) {
      pvVar10 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                          ((vector<Channel,_std::allocator<Channel>_> *)(in_RDI + 0x38),
                           (long)*(int *)(in_RDI + 0x50));
      pvVar11 = std::vector<MessageWithReplies,_std::allocator<MessageWithReplies>_>::operator[]
                          (&pvVar10->messages,(long)local_58);
      (pvVar11->msg).reactUp = (pvVar11->msg).reactUp + 1;
    }
    if ((local_ea & 1) != 0) {
      *(undefined1 *)(in_RDI + 0x30) = 1;
      *(undefined4 *)(in_RDI + 0x74) = *(undefined4 *)(in_RDI + 0x50);
      *(int *)(in_RDI + 0x78) = local_58;
    }
    ImGui::PopID();
    local_1c = *local_68;
    local_58 = local_58 + 1;
  }
  ImGui::PopTextWrapPos();
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  return true;
}

Assistant:

bool UI::renderMessages(const std::vector<MessageWithReplies> & messages, int width, bool isThread) {
    int32_t lastUid = -1;
    std::string lastDate = "";

    ImGui::PushTextWrapPos(width - 4);

    for (int i = 0; i < (int) messages.size(); i++) {
        const auto & message = messages[i];
        const auto & uid = message.msg.uid;
        const auto & user = users[uid];

        ImGui::PushID(i);

        // render new date separator
        {
            const auto curDate = tToDate(message.msg.t_s);
            if (curDate != lastDate) {
                const auto l = curDate.size() + 6;

                ImGui::Text("%s", "");
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                ImGui::SameLine();
                ImGui::Text("%s", curDate.c_str());
                ImGui::SameLine();
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                lastDate = curDate;
            }
        }

        const auto p0 = ImVec2 { ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y };

        if (lastUid != uid) {
            ImGui::Text("%s", "");
            ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
            ImGui::SameLine();
            ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
        }
        ImGui::Text("%s", message.msg.text.c_str());
        if (message.msg.reactUp > 0) {
            ImGui::TextColored(colors.messageReact, "%s", "[+]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactUp);
        }

        if (message.msg.reactDown > 0) {
            if (message.msg.reactUp > 0) {
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReact, "%s", "[-]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactDown);
        }

        if (message.replies.size() > 0) {
            if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                ImGui::SameLine();
                ImGui::Text("|");
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
        }

        const auto p1 = ImVec2 { ImGui::GetCursorScreenPos().x + width, ImGui::GetCursorScreenPos().y };

        bool doUpvote = false;
        bool doReplyInThead = false;

        if (ImGui::IsWindowHovered() && ImGui::IsMouseHoveringRect(p0, p1)) {
            auto drawList = ImGui::GetWindowDrawList();

            drawList->AddRectFilled({ p0.x, p0.y + 1 }, { p1.x, p1.y - 1 }, ImGui::ColorConvertFloat4ToU32(colors.messageHovered));

            ImGui::SetCursorScreenPos(p0);

            if (lastUid != uid) {
                ImGui::Text("%s", "");
                ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
                ImGui::SameLine();
                ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
            }
            ImGui::Text("%s", message.msg.text.c_str());
            if (message.msg.reactUp > 0) {
                ImGui::TextColored(colors.messageReact, "%s", "[+]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[+]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactUp; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                           i == message.msg.reactUp - 1 ? "" : i == message.msg.reactUp - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :+1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactUp);
            }

            if (message.msg.reactDown > 0) {
                if (message.msg.reactUp > 0) {
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReact, "%s", "[-]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[-]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactDown; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                             i == message.msg.reactDown - 1 ? "" : i == message.msg.reactDown - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :-1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactDown);
            }

            if (message.replies.size() > 0) {
                if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                    ImGui::SameLine();
                    ImGui::Text("|");
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
                if (ImGui::IsItemHovered()) {
                    ImGui::SameLine();
                    ImGui::SmallButton("View thread");
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                }
            }

            auto savePos = ImGui::GetCursorScreenPos();

            const int offsetX = isThread ? 7 : 12;

            ImGui::SetCursorScreenPos({ p1.x - offsetX, p0.y });
            ImGui::SmallButton("[+]");
            if (ImGui::IsItemHovered()) {
                if (ImGui::IsMouseReleased(0)) {
                    doUpvote = true;
                }
                ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, ImGui::GetIO().MousePos.y - 2 });
                ImGui::SetTooltip("React with +1");
            }

            if (!isThread) {
                ImGui::SameLine();
                ImGui::SmallButton("[>]");
                if (ImGui::IsItemHovered()) {
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 16, ImGui::GetIO().MousePos.y - 2 });
                    ImGui::SetTooltip("Reply in thread");
                }
            }

            ImGui::SetCursorScreenPos(savePos);
        }

        if (doUpvote) {
            if (!isThread) {
                channels[selectedChannel].messages[i].msg.reactUp++;
            }
        }

        if (doReplyInThead) {
            showThreadPanel = true;
            threadChannel = selectedChannel;
            threadMessage = i;
        }

        ImGui::PopID();

        lastUid = uid;
    }

    ImGui::PopTextWrapPos();

    return true;
}